

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets.cpp
# Opt level: O0

bool __thiscall TimeOffsets::WarnIfOutOfSync(TimeOffsets *this)

{
  long lVar1;
  warning_type id;
  string_view source_file;
  string_view logging_function;
  strong_ordering sVar2;
  long lVar3;
  char *pcVar4;
  duration<long,_std::ratio<1L,_1L>_> *pdVar5;
  enable_if_t<numeric_limits<long>::is_signed,_duration<long,_ratio<1L,_1L>_>_> eVar6;
  ConstevalFormatString<1U> fmt;
  TimeOffsets *in_RDI;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1L>_> median;
  bilingual_str msg;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe3c;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffe40;
  Warning *__t;
  duration<long,_std::ratio<60L,_1L>_> in_stack_fffffffffffffe48;
  variant<kernel::Warning,_node::Warning> *this_00;
  duration<long,_std::ratio<1L,_1L>_> in_stack_fffffffffffffe50;
  bilingual_str *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  _Variant_storage_alias<kernel::Warning,_node::Warning> in_stack_fffffffffffffe68;
  Warnings *this_01;
  ConstevalStringLiteral in_stack_fffffffffffffe88;
  long *in_stack_fffffffffffffe90;
  bilingual_str *in_stack_fffffffffffffe98;
  char *flag;
  _Variadic_union<kernel::Warning,_node::Warning> in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int source_line;
  bool local_145;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  char *pcVar8;
  variant<kernel::Warning,_node::Warning> local_48 [5];
  Level in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Median(in_RDI);
  lVar3 = std::numeric_limits<long>::min();
  pcVar4 = (char *)(lVar3 + 1);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),(long *)0x4d757e);
  pdVar5 = std::max<std::chrono::duration<long,std::ratio<1l,1l>>>
                     ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe48.__r,
                      in_stack_fffffffffffffe40);
  pcVar8 = (char *)pdVar5->__r;
  eVar6 = std::chrono::abs<long,std::ratio<1l,1l>>(in_stack_fffffffffffffe50);
  sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<60L,_1L>_>
                    ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe50.__r,
                     (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffe48.__r);
  source_line = CONCAT13(sVar2._M_value,(int3)in_stack_fffffffffffffeac);
  std::__cmp_cat::__unspec::__unspec
            ((__unspec *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             (__unspec *)0x4d75ec);
  local_145 = std::operator<=((char)((uint)source_line >> 0x18));
  if (local_145) {
    std::variant<kernel::Warning,node::Warning>::variant<node::Warning,void,void,node::Warning,void>
              ((variant<kernel::Warning,_node::Warning> *)in_stack_fffffffffffffe48.__r,
               (Warning *)in_stack_fffffffffffffe40);
    ::node::Warnings::Unset
              ((Warnings *)in_stack_fffffffffffffe50.__r,(warning_type)in_stack_fffffffffffffe68);
  }
  else {
    flag = 
    "Your computer\'s date and time appear to be more than %d minutes out of sync with the network, this may lead to consensus failure. After you\'ve confirmed your computer\'s clock, this message should no longer appear when you restart your node. Without a restart, it should stop showing automatically after you\'ve connected to a sufficient number of new outbound peers, which may take some time. You can inspect the `timeoffset` field of the `getpeerinfo` and `getnetworkinfo` RPC methods to get more info."
    ;
    ::_(in_stack_fffffffffffffe88);
    fmt.fmt = (char *)Ticks<std::chrono::duration<long,std::ratio<60l,1l>>,std::chrono::duration<long,std::ratio<60l,1l>>>
                                (in_stack_fffffffffffffe48);
    tinyformat::format<long>(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe58,
               (char *)in_stack_fffffffffffffe50.__r);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe58,
               (char *)in_stack_fffffffffffffe50.__r);
    this_00 = local_48;
    __t = (Warning *)0x1173c95;
    uVar7 = 3;
    logging_function._M_str = pcVar4;
    logging_function._M_len = eVar6.__r;
    source_file._M_len._4_4_ = in_stack_fffffffffffffef4;
    source_file._M_len._0_4_ = in_stack_fffffffffffffef0;
    source_file._M_str = pcVar8;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,source_line,(LogFlags)flag,in_stack_ffffffffffffffe0,fmt
               ,in_stack_fffffffffffffff0);
    this_01 = in_RDI->m_warnings;
    std::variant<kernel::Warning,node::Warning>::variant<node::Warning,void,void,node::Warning,void>
              (this_00,__t);
    bilingual_str::bilingual_str
              (in_stack_fffffffffffffe58,(bilingual_str *)in_stack_fffffffffffffe50.__r);
    id.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._4_4_ = source_line;
    id.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_u = in_stack_fffffffffffffea8;
    ::node::Warnings::Set
              (this_01,id,
               (bilingual_str *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffffe3c,uVar7));
    bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffffe3c,uVar7));
  }
  local_145 = !local_145;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_145;
  }
  __stack_chk_fail();
}

Assistant:

bool TimeOffsets::WarnIfOutOfSync() const
{
    // when median == std::numeric_limits<int64_t>::min(), calling std::chrono::abs is UB
    auto median{std::max(Median(), std::chrono::seconds(std::numeric_limits<int64_t>::min() + 1))};
    if (std::chrono::abs(median) <= WARN_THRESHOLD) {
        m_warnings.Unset(node::Warning::CLOCK_OUT_OF_SYNC);
        return false;
    }

    bilingual_str msg{strprintf(_(
        "Your computer's date and time appear to be more than %d minutes out of sync with the network, "
        "this may lead to consensus failure. After you've confirmed your computer's clock, this message "
        "should no longer appear when you restart your node. Without a restart, it should stop showing "
        "automatically after you've connected to a sufficient number of new outbound peers, which may "
        "take some time. You can inspect the `timeoffset` field of the `getpeerinfo` and `getnetworkinfo` "
        "RPC methods to get more info."
    ), Ticks<std::chrono::minutes>(WARN_THRESHOLD))};
    LogWarning("%s\n", msg.original);
    m_warnings.Set(node::Warning::CLOCK_OUT_OF_SYNC, msg);
    return true;
}